

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813::ChElementHexaANCF_3813(ChElementHexaANCF_3813 *this,void **vtt)

{
  ChLoadableUVW CVar1;
  _func_int **pp_Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  
  auVar3 = ZEXT816(0) << 0x40;
  (this->super_ChElementHexahedron)._vptr_ChElementHexahedron =
       (_func_int **)&PTR__ChElementHexahedron_01180e88;
  (this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase =
       (_func_int **)&PTR__ChElementGeneric_0117f7d0;
  (this->super_ChElementGeneric).Kmatr.super_ChKblock._vptr_ChKblock =
       (_func_int **)&PTR__ChKblockGeneric_01186748;
  auVar4 = ZEXT1632(auVar3);
  (this->super_ChElementGeneric).Kmatr.K = (ChMatrixDynamic<double>)auVar4._0_24_;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar4._24_8_;
  *(undefined1 (*) [32])
   &(this->super_ChElementGeneric).Kmatr.K.
    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = auVar4;
  CVar1 = *(ChLoadableUVW *)(vtt + 1);
  this->super_ChLoadableUVW = CVar1;
  *(void **)((long)(this->m_StiffnessMatrix).
                   super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data
                   .array + *(long *)((long)CVar1 + -0x78) + -0x38) = vtt[2];
  pp_Var2 = (_func_int **)*vtt;
  (this->super_ChElementHexahedron)._vptr_ChElementHexahedron = pp_Var2;
  (this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase = (_func_int **)0x1181430;
  this->super_ChLoadableUVW = *(ChLoadableUVW *)(vtt + 3);
  *(void **)(pp_Var2[-3] + -0x80 +
            (long)&(this->m_StiffnessMatrix).
                   super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>) = vtt[4];
  (this->m_InertFlexVec).m_data[0] = 0.0;
  (this->m_InertFlexVec).m_data[1] = 0.0;
  (this->m_InertFlexVec).m_data[2] = 0.0;
  this->m_flag_HE = ANALYTICAL;
  (this->m_Material).super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_nodes =
       (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
        )SUB3224(ZEXT1632(auVar3),0);
  (this->m_Material).super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)SUB328(ZEXT1632(auVar3),0x18);
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ::resize(&this->m_nodes,8);
  return;
}

Assistant:

ChElementHexaANCF_3813::ChElementHexaANCF_3813() : m_flag_HE(ANALYTICAL) {
    m_nodes.resize(8);
}